

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complex_polymorphism.h
# Opt level: O3

void density_tests::
     polymorphic_consume<density_tests::Derived2,density::sp_heter_queue<density::runtime_type<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,density::default_busy_wait>::consume_operation>
               (consume_operation *i_consume)

{
  _Tuple_impl<5UL,_density::f_alignment> _Var1;
  int iVar2;
  runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
  *prVar3;
  Derived2 *pDVar4;
  void *pvVar5;
  
  prVar3 = density::
           sp_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
           ::consume_operation::complete_type(i_consume);
  if (prVar3->m_feature_table !=
      (tuple_type *)
      density::detail::
      FeatureTable<std::tuple<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density_tests::Derived2>
      ::s_table) {
    detail::assert_failed<>
              ("i_consume.complete_type().template is<EXPECTED_TYPE>()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/complex_polymorphism.h"
               ,0x93);
  }
  pDVar4 = density::
           sp_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
           ::consume_operation::element<density_tests::Derived2>(i_consume);
  Derived2::check(pDVar4);
  pDVar4 = density::
           sp_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
           ::consume_operation::element<density_tests::Derived2>(i_consume);
  iVar2 = (**pDVar4->_vptr_Derived2)(pDVar4);
  if (iVar2 != 0x19) {
    detail::assert_failed<>
              ("i_consume.template element<EXPECTED_TYPE>().class_id() == EXPECTED_TYPE::s_class_id"
               ,
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/complex_polymorphism.h"
               ,0x9a);
  }
  pvVar5 = density::
           sp_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
           ::consume_operation::unaligned_element_ptr(i_consume);
  prVar3 = density::
           sp_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
           ::consume_operation::complete_type(i_consume);
  _Var1.super__Head_base<5UL,_density::f_alignment,_false>._M_head_impl.m_alignment =
       (prVar3->m_feature_table->
       super__Tuple_impl<0UL,_density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
       ).
       super__Tuple_impl<1UL,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
       .
       super__Tuple_impl<2UL,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
       .super__Tuple_impl<3UL,_density::f_destroy,_density::f_size,_density::f_alignment>.
       super__Tuple_impl<4UL,_density::f_size,_density::f_alignment>.
       super__Tuple_impl<5UL,_density::f_alignment>.
       super__Head_base<5UL,_density::f_alignment,_false>;
  if (((ulong)_Var1.super__Head_base<5UL,_density::f_alignment,_false>._M_head_impl.m_alignment &
      (long)_Var1.super__Head_base<5UL,_density::f_alignment,_false>._M_head_impl.m_alignment - 1U)
      != 0) {
    detail::assert_failed<>
              ("is_power_of_2(i_alignment)",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/density_common.h"
               ,0x10a);
  }
  pDVar4 = (Derived2 *)
           (-(long)_Var1.super__Head_base<5UL,_density::f_alignment,_false>._M_head_impl.m_alignment
           & (long)pvVar5 +
             ((long)_Var1.super__Head_base<5UL,_density::f_alignment,_false>._M_head_impl.
                    m_alignment - 1U));
  Derived2::check(pDVar4);
  iVar2 = (**pDVar4->_vptr_Derived2)(pDVar4);
  if (iVar2 != 0x19) {
    detail::assert_failed<>
              ("element_ptr->class_id() == EXPECTED_TYPE::s_class_id",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/complex_polymorphism.h"
               ,0xa1);
  }
  density::
  sp_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::consume_operation::commit(i_consume);
  return;
}

Assistant:

void polymorphic_consume(CONSUME_OPERATION i_consume)
    {
        DENSITY_TEST_ASSERT(i_consume.complete_type().template is<EXPECTED_TYPE>());

        //i_consume.element_ptr()->check();
        i_consume.template element<EXPECTED_TYPE>().check();

        //DENSITY_TEST_ASSERT(i_consume.element_ptr()->class_id() == EXPECTED_TYPE::s_class_id);
        DENSITY_TEST_ASSERT(
          i_consume.template element<EXPECTED_TYPE>().class_id() == EXPECTED_TYPE::s_class_id);

        auto const unaligned_element_ptr = i_consume.unaligned_element_ptr();
        auto const untyped_element_ptr   = density::address_upper_align(
          unaligned_element_ptr, i_consume.complete_type().alignment());
        auto const element_ptr = static_cast<EXPECTED_TYPE *>(untyped_element_ptr);
        element_ptr->check();
        DENSITY_TEST_ASSERT(element_ptr->class_id() == EXPECTED_TYPE::s_class_id);

        i_consume.commit();
    }